

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

bool wabt::anon_unknown_0::func_uses_simd(FuncSignature *sig)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  bool local_3a;
  FuncSignature *sig_local;
  
  cVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::begin(&sig->param_types);
  cVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::end(&sig->param_types);
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<wabt::Type_const*,std::vector<wabt::Type,std::allocator<wabt::Type>>>,wabt::(anonymous_namespace)::func_uses_simd(wabt::FuncSignature_const&)::__0>
                    (cVar2._M_current,cVar3._M_current);
  local_3a = true;
  if (!bVar1) {
    cVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::begin(&sig->result_types);
    cVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::end(&sig->result_types);
    local_3a = std::
               any_of<__gnu_cxx::__normal_iterator<wabt::Type_const*,std::vector<wabt::Type,std::allocator<wabt::Type>>>,wabt::(anonymous_namespace)::func_uses_simd(wabt::FuncSignature_const&)::__1>
                         (cVar2._M_current,cVar3._M_current);
  }
  return local_3a;
}

Assistant:

static bool func_uses_simd(const FuncSignature& sig) {
  return std::any_of(sig.param_types.begin(), sig.param_types.end(),
                     [](auto x) { return x == Type::V128; }) ||
         std::any_of(sig.result_types.begin(), sig.result_types.end(),
                     [](auto x) { return x == Type::V128; });
}